

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

IdentPtr __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::GetSecondaryBufferAsPid
          (Scanner<UTF8EncodingPolicyBase<false>_> *this)

{
  IdentPtr pIVar1;
  
  if ((this->field_0x508 & 0x40) == 0) {
    pIVar1 = HashTbl::PidHashNameLen<char16_t>
                       (&this->m_htbl,(this->m_tempChBufSecondary).m_prgch,
                        (this->m_tempChBufSecondary).m_ichCur);
    return pIVar1;
  }
  return (IdentPtr)0x0;
}

Assistant:

IdentPtr Scanner<EncodingPolicy>::GetSecondaryBufferAsPid()
{
    bool createPid = true;

    if ((m_DeferredParseFlags & ScanFlagSuppressStrPid) != 0)
    {
        createPid = false;
    }

    if (createPid)
    {
        return this->GetHashTbl()->PidHashNameLen(m_tempChBufSecondary.m_prgch, m_tempChBufSecondary.m_ichCur);
    }
    else
    {
        return nullptr;
    }
}